

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O2

void __thiscall
JetHead::vector<URI::QueryParam>::push_back(vector<URI::QueryParam> *this,QueryParam *val)

{
  uint uVar1;
  
  uVar1 = this->mSize;
  if (uVar1 == this->mAllocated) {
    sizeup(this,0);
    uVar1 = this->mSize;
  }
  URI::QueryParam::QueryParam(this->mData + uVar1,val);
  this->mSize = this->mSize + 1;
  return;
}

Assistant:

void push_back(const T& val)
		{
			// If we've hit our limit, grow the array
			if (mSize == mAllocated)
			{
				sizeup();
			}
 
			// Now that we've got space, placement-new a copy of val
			new(mData + mSize) T(val);

			// And remember that we've stored another object
			mSize++;
		}